

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  key_type *__k;
  bool bVar4;
  Type *pTVar5;
  iterator iVar6;
  mapped_type_conflict1 *pmVar7;
  void **ppvVar8;
  _Rb_tree_header *p_Var9;
  long lVar10;
  string err;
  Result r;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar4 = Result::good(&r);
  if (bVar4) {
    validateOutputCount((Result *)&err,layer,2,-1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar4 = Result::good(&r);
  if ((bVar4) && (this->ndArrayInterpretation == true)) {
    std::__cxx11::string::string((string *)&local_50,"Split",(allocator *)&local_b0);
    this_00 = &this->blobNameToRank;
    validateInputOutputRankEquality((Result *)&err,layer,&local_50,this_00);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    bVar4 = Result::good(&r);
    if (bVar4) {
      std::__cxx11::string::string((string *)&local_b0,"Split",(allocator *)&local_90);
      validateRankCount((Result *)&err,layer,&local_b0,3,-1,this_00);
      Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_b0);
      bVar4 = Result::good(&r);
      if (bVar4) {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&(layer->output_).super_RepeatedPtrFieldBase,0);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,pTVar5);
        p_Var9 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar6._M_node != p_Var9) {
          pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->output_).super_RepeatedPtrFieldBase,0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,pTVar5);
          pRVar3 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
          ppvVar8 = pRVar3->elements;
          if (pRVar3 == (Rep *)0x0) {
            ppvVar8 = (void **)0x0;
          }
          iVar1 = *pmVar7;
          iVar2 = (layer->output_).super_RepeatedPtrFieldBase.current_size_;
          for (lVar10 = 0; (long)iVar2 * 8 != lVar10; lVar10 = lVar10 + 8) {
            __k = *(key_type **)((long)ppvVar8 + lVar10);
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&this_00->_M_t,__k);
            if (((_Rb_tree_header *)iVar6._M_node != p_Var9) &&
               (pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::at(this_00,__k), iVar1 != *pmVar7)) {
              err._M_dataplus._M_p = (pointer)&err.field_2;
              err._M_string_length = 0;
              err.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::string((string *)&local_70,(string *)(layer->name_).ptr_);
              std::operator+(&local_90,"Layer \'",&local_70);
              std::operator+(&local_b0,&local_90,
                             "\' of type \'Split\' must have equal ranks for its outputs, but they are not equal."
                            );
              std::__cxx11::string::operator=((string *)&err,(string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              std::__cxx11::string::~string((string *)&err);
              goto LAB_00590f0e;
            }
          }
        }
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_00590f0e:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        // between 2 and any number of outputs
        r = validateOutputCount(layer, 2, -1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Split", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Split", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        // check that all outputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.output(0));
        } else {
            return r;
        }

        for (const auto& output : layer.output()) {
            if (blobNameToRank.find(output) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(output)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Split' must have equal ranks for its outputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}